

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O2

void __thiscall Handler::InputRequest(Handler *this,uint16_t *startDay,uint16_t *endDay)

{
  char cVar1;
  int iVar2;
  ushort uVar3;
  uint uVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  uint uVar7;
  long lVar8;
  ushort uVar9;
  ulong __new_size;
  ulong uVar10;
  ushort local_11e;
  string idStr;
  string modelStr;
  int id;
  string operationStr;
  vector<Request,_std::allocator<Request>_> request;
  string RStr;
  
  RStr._M_dataplus._M_p = (pointer)&RStr.field_2;
  RStr._M_string_length = 0;
  RStr.field_2._M_local_buf[0] = '\0';
  uVar9 = *startDay;
  while( true ) {
    if (*endDay <= uVar9) break;
    operationStr._M_dataplus._M_p = (pointer)&operationStr.field_2;
    operationStr._M_string_length = 0;
    modelStr._M_dataplus._M_p = (pointer)&modelStr.field_2;
    modelStr._M_string_length = 0;
    operationStr.field_2._M_local_buf[0] = '\0';
    modelStr.field_2._M_local_buf[0] = '\0';
    idStr._M_dataplus._M_p = (pointer)&idStr.field_2;
    idStr._M_string_length = 0;
    idStr.field_2._M_local_buf[0] = '\0';
    std::operator>>((istream *)&std::cin,(string *)&RStr);
    uVar4 = std::__cxx11::stoi(&RStr,(size_t *)0x0,10);
    __new_size = (ulong)(uVar4 & 0xffff);
    std::vector<RequestResult,_std::allocator<RequestResult>_>::resize
              (&(this->result).super__Vector_base<Result,_std::allocator<Result>_>._M_impl.
                super__Vector_impl_data._M_start[uVar9].requestResult,__new_size);
    std::vector<Request,_std::allocator<Request>_>::vector
              (&request,__new_size,(allocator_type *)&id);
    uVar4 = 0;
    for (uVar10 = 0; uVar10 != __new_size; uVar10 = uVar10 + 1) {
      std::operator>>((istream *)&std::cin,(string *)&operationStr);
      cVar1 = operationStr._M_dataplus._M_p[1];
      if (cVar1 == 'a') {
        std::operator>>((istream *)&std::cin,(string *)&modelStr);
        std::__cxx11::string::substr((ulong)&id,(ulong)&modelStr);
        pmVar5 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&this->virtualMachineMap,(key_type *)&id);
        local_11e = *pmVar5;
        std::__cxx11::string::~string((string *)&id);
      }
      std::operator>>((istream *)&std::cin,(string *)&idStr);
      id = 0;
      for (lVar8 = 0; iVar2 = id, idStr._M_string_length - 1 != lVar8; lVar8 = lVar8 + 1) {
        id = id * 10 + (int)idStr._M_dataplus._M_p[lVar8] + -0x30;
      }
      if (cVar1 == 'a') {
        pmVar6 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->idVirtualMachineMap,&id);
        *pmVar6 = (uint)local_11e;
        uVar3 = local_11e;
        uVar7 = uVar4;
        uVar4 = uVar4 + 1;
      }
      else {
        pmVar6 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->idVirtualMachineMap,&id);
        uVar3 = (ushort)*pmVar6;
        uVar7 = 0;
      }
      request.super__Vector_base<Request,_std::allocator<Request>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar10].add = cVar1 == 'a';
      request.super__Vector_base<Request,_std::allocator<Request>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar10].addIdx = uVar7;
      request.super__Vector_base<Request,_std::allocator<Request>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar10].vmIdx = uVar3;
      request.super__Vector_base<Request,_std::allocator<Request>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar10].vmId = iVar2;
    }
    std::vector<Request,_std::allocator<Request>_>::operator=
              ((this->requests).
               super__Vector_base<std::vector<Request,_std::allocator<Request>_>,_std::allocator<std::vector<Request,_std::allocator<Request>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar9,
               (vector<Request,_std::allocator<Request>_> *)
               &request.super__Vector_base<Request,_std::allocator<Request>_>);
    (this->addRequestCounts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[uVar9] = uVar4;
    std::_Vector_base<Request,_std::allocator<Request>_>::~_Vector_base
              (&request.super__Vector_base<Request,_std::allocator<Request>_>);
    std::__cxx11::string::~string((string *)&idStr);
    std::__cxx11::string::~string((string *)&modelStr);
    std::__cxx11::string::~string((string *)&operationStr);
    uVar9 = uVar9 + 1;
  }
  std::__cxx11::string::~string((string *)&RStr);
  return;
}

Assistant:

void Handler::InputRequest(const uint16_t &startDay, const uint16_t &endDay) {
    string RStr;
    uint16_t vmIdx;

    for (uint16_t i = startDay; i < endDay; ++i) {
        uint32_t R;
        string operationStr, modelStr, idStr;
        std::cin >> RStr;
        R = (uint16_t) std::stoi(RStr);
        result[i].requestResult.resize(R);
        std::vector<Request> request(R);
        uint32_t addRequestCount = 0u;

        for (uint32_t j = 0u; j < R; ++j) {
            Request req;

            std::cin >> operationStr;
            req.add = (operationStr[1] == 'a');
            if (req.add) {
                std::cin >> modelStr;
                vmIdx = virtualMachineMap[modelStr.substr(0, modelStr.size() - 1)];
            }

            std::cin >> idStr;
            int id = 0;
            for (int k = 0; k < idStr.size() - 1; ++k) {
                id = id * 10 + (idStr[k] - 48);
            }
            req.vmId = id;

            if (req.add) {
                req.addIdx = addRequestCount++;
                req.vmIdx = vmIdx;
                idVirtualMachineMap[id] = vmIdx;
            } else {
                req.vmIdx = idVirtualMachineMap[id];
            }

            request[j] = req;
        }

        requests[i] = request;
        addRequestCounts[i] = addRequestCount;
    }
}